

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::NeedDyndepForSource
          (cmGeneratorTarget *this,string *lang,string *config,cmSourceFile *sf)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  bool bVar2;
  Cxx20SupportLevel CVar3;
  int iVar4;
  PolicyStatus PVar5;
  cmFileSet *this_00;
  string *this_01;
  cmGlobalGenerator *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  byte local_17d;
  bool local_149;
  bool local_13a;
  allocator<char> local_139;
  undefined1 local_138 [6];
  bool policyAnswer;
  cmValue local_118;
  cmValue tgtProp;
  allocator<char> local_f9;
  string local_f8;
  cmValue local_d8;
  cmValue sfProp;
  bool haveGeneratorSupport;
  bool haveRule;
  cmFileSet *fs;
  cmSourceFile *sf_local;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
  bVar7 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("Fortran",7);
  bVar2 = std::operator==(_Var1,bVar7);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
    bVar7 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX",3);
    bVar2 = std::operator!=(_Var1,bVar7);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = GetFileSetForSource(this,config,sf);
      local_149 = false;
      if (this_00 != (cmFileSet *)0x0) {
        this_01 = cmFileSet::GetType_abi_cxx11_(this_00);
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
        bVar7 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("CXX_MODULES",0xb);
        local_149 = std::operator==(_Var1,bVar7);
      }
      if (local_149 == false) {
        sfProp.Value._7_1_ = 0;
        CVar3 = HaveCxxModuleSupport(this,config);
        if (CVar3 < MissingRule) {
          this_local._7_1_ = false;
        }
        else {
          if ((CVar3 != MissingRule) && (CVar3 == Supported)) {
            sfProp.Value._7_1_ = 1;
          }
          pcVar6 = GetGlobalGenerator(this);
          iVar4 = (*pcVar6->_vptr_cmGlobalGenerator[0xe])(pcVar6,1);
          sfProp.Value._6_1_ = (byte)iVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"CXX_SCAN_FOR_MODULES",&local_f9);
          local_d8 = cmSourceFile::GetProperty(sf,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator(&local_f9);
          bVar2 = cmValue::IsSet(&local_d8);
          if (bVar2) {
            this_local._7_1_ = cmValue::IsOn(&local_d8);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_138,"CXX_SCAN_FOR_MODULES",&local_139);
            local_118 = GetProperty(this,(string *)local_138);
            std::__cxx11::string::~string((string *)local_138);
            std::allocator<char>::~allocator(&local_139);
            bVar2 = cmValue::IsSet(&local_118);
            if (bVar2) {
              this_local._7_1_ = cmValue::IsOn(&local_118);
            }
            else {
              local_13a = false;
              PVar5 = GetPolicyStatusCMP0155(this);
              if (PVar5 < NEW) {
                local_13a = false;
              }
              else if (PVar5 - NEW < 3) {
                local_17d = 0;
                if ((sfProp.Value._7_1_ & 1) != 0) {
                  local_17d = sfProp.Value._6_1_;
                }
                local_13a = (bool)(local_17d & 1);
              }
              this_local._7_1_ = local_13a;
            }
          }
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::NeedDyndepForSource(std::string const& lang,
                                            std::string const& config,
                                            cmSourceFile const* sf) const
{
  // Fortran always needs to be scanned.
  if (lang == "Fortran"_s) {
    return true;
  }
  // Only C++ code needs scanned otherwise.
  if (lang != "CXX"_s) {
    return false;
  }

  // Any file in `CXX_MODULES` file sets need scanned (it being `CXX` is
  // enforced elsewhere).
  auto const* fs = this->GetFileSetForSource(config, sf);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    return true;
  }

  bool haveRule = false;
  switch (this->HaveCxxModuleSupport(config)) {
    case Cxx20SupportLevel::MissingCxx:
    case Cxx20SupportLevel::NoCxx20:
      return false;
    case Cxx20SupportLevel::MissingRule:
      break;
    case Cxx20SupportLevel::Supported:
      haveRule = true;
      break;
  }
  bool haveGeneratorSupport =
    this->GetGlobalGenerator()->CheckCxxModuleSupport(
      cmGlobalGenerator::CxxModuleSupportQuery::Inspect);
  auto const sfProp = sf->GetProperty("CXX_SCAN_FOR_MODULES");
  if (sfProp.IsSet()) {
    return sfProp.IsOn();
  }
  auto const tgtProp = this->GetProperty("CXX_SCAN_FOR_MODULES");
  if (tgtProp.IsSet()) {
    return tgtProp.IsOn();
  }

  bool policyAnswer = false;
  switch (this->GetPolicyStatusCMP0155()) {
    case cmPolicies::WARN:
    case cmPolicies::OLD:
      // The OLD behavior is to not scan the source.
      policyAnswer = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      // The NEW behavior is to scan the source if the compiler supports
      // scanning and the generator supports it.
      policyAnswer = haveRule && haveGeneratorSupport;
      break;
  }
  return policyAnswer;
}